

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_4_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  long lVar41;
  short sVar42;
  undefined1 auVar43 [16];
  short sVar44;
  undefined4 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar52;
  undefined1 auVar50 [16];
  ushort uVar53;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  undefined1 auVar55 [16];
  ushort uVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i hev;
  __m128i mask;
  __m128i blimit;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i thresh;
  __m128i limit;
  __m128i pq [2];
  short sVar54;
  short sVar67;
  
  lVar41 = (long)p;
  pq[0][0] = *(longlong *)(s + -lVar41);
  pq[0][1] = *(longlong *)s;
  pq[1][1] = *(longlong *)(s + lVar41);
  pq[1][0] = *(longlong *)(s + -(long)(p * 2));
  auVar46 = *(undefined1 (*) [16])_blimit;
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar46._0_13_;
  auVar15[0xe] = auVar46[7];
  auVar18[0xc] = auVar46[6];
  auVar18._0_12_ = auVar46._0_12_;
  auVar18._13_2_ = auVar15._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar46._0_11_;
  auVar21._12_3_ = auVar18._12_3_;
  auVar24[10] = auVar46[5];
  auVar24._0_10_ = auVar46._0_10_;
  auVar24._11_4_ = auVar21._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar46._0_9_;
  auVar27._10_5_ = auVar24._10_5_;
  auVar30[8] = auVar46[4];
  auVar30._0_8_ = auVar46._0_8_;
  auVar30._9_6_ = auVar27._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar30._8_7_;
  auVar35._1_8_ = SUB158(auVar32 << 0x40,7);
  auVar35[0] = auVar46[3];
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = auVar46[2];
  auVar36._11_4_ = 0;
  auVar43._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar43[2] = auVar46[1];
  auVar43[0] = auVar46[0];
  auVar43[1] = 0;
  auVar43[0xf] = 0;
  auVar48 = ZEXT416(bd - 8);
  blimit = (__m128i)psllw(auVar43,auVar48);
  auVar46 = *(undefined1 (*) [16])_limit;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar46._0_13_;
  auVar13[0xe] = auVar46[7];
  auVar16[0xc] = auVar46[6];
  auVar16._0_12_ = auVar46._0_12_;
  auVar16._13_2_ = auVar13._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar46._0_11_;
  auVar19._12_3_ = auVar16._12_3_;
  auVar22[10] = auVar46[5];
  auVar22._0_10_ = auVar46._0_10_;
  auVar22._11_4_ = auVar19._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar46._0_9_;
  auVar25._10_5_ = auVar22._10_5_;
  auVar28[8] = auVar46[4];
  auVar28._0_8_ = auVar46._0_8_;
  auVar28._9_6_ = auVar25._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar28._8_7_;
  auVar37._1_8_ = SUB158(auVar33 << 0x40,7);
  auVar37[0] = auVar46[3];
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = auVar46[2];
  auVar38._11_4_ = 0;
  auVar31[2] = auVar46[1];
  auVar31._0_2_ = auVar46._0_2_;
  auVar31._3_12_ = SUB1512(auVar38 << 0x20,3);
  auVar47._0_2_ = auVar46._0_2_ & 0xff;
  auVar47._2_13_ = auVar31._2_13_;
  auVar47[0xf] = 0;
  limit = (__m128i)psllw(auVar47,auVar48);
  auVar46 = *(undefined1 (*) [16])_thresh;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar46._0_13_;
  auVar14[0xe] = auVar46[7];
  auVar17[0xc] = auVar46[6];
  auVar17._0_12_ = auVar46._0_12_;
  auVar17._13_2_ = auVar14._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar46._0_11_;
  auVar20._12_3_ = auVar17._12_3_;
  auVar23[10] = auVar46[5];
  auVar23._0_10_ = auVar46._0_10_;
  auVar23._11_4_ = auVar20._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar46._0_9_;
  auVar26._10_5_ = auVar23._10_5_;
  auVar29[8] = auVar46[4];
  auVar29._0_8_ = auVar46._0_8_;
  auVar29._9_6_ = auVar26._9_6_;
  auVar34._7_8_ = 0;
  auVar34._0_7_ = auVar29._8_7_;
  auVar39._1_8_ = SUB158(auVar34 << 0x40,7);
  auVar39[0] = auVar46[3];
  auVar39._9_6_ = 0;
  auVar40._1_10_ = SUB1510(auVar39 << 0x30,5);
  auVar40[0] = auVar46[2];
  auVar40._11_4_ = 0;
  auVar55._3_12_ = SUB1512(auVar40 << 0x20,3);
  auVar55[2] = auVar46[1];
  auVar55[0] = auVar46[0];
  auVar55[1] = 0;
  auVar55[0xf] = 0;
  thresh = (__m128i)psllw(auVar55,auVar48);
  auVar46 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar46 = pshuflw(auVar46,auVar46,0);
  uVar45 = auVar46._0_4_;
  highbd_hev_filter_mask_x_sse2(pq,2,&p1p0,&q1q0,&abs_p1p0,&limit,&blimit,&thresh,&hev,&mask);
  auVar46 = psllw(_DAT_0046e8b0,ZEXT416((uint)bd));
  auVar70._8_4_ = 0xffffffff;
  auVar70._0_8_ = 0xffffffffffffffff;
  auVar70._12_4_ = 0xffffffff;
  auVar48 = paddsw(auVar46,auVar70);
  auVar46._4_4_ = uVar45;
  auVar46._0_4_ = uVar45;
  auVar46._8_4_ = uVar45;
  auVar46._12_4_ = uVar45;
  auVar48 = psubsw(auVar48,auVar46);
  auVar70 = psubsw((undefined1  [16])0x0,auVar46);
  auVar47 = psubsw((undefined1  [16])p1p0,auVar46);
  auVar43 = psubsw((undefined1  [16])q1q0,auVar46);
  auVar55 = psubsw(auVar47,auVar43);
  sVar51 = auVar48._0_2_;
  sVar54 = auVar55._0_2_;
  uVar53 = (ushort)(sVar51 < sVar54) * sVar51 | (ushort)(sVar51 >= sVar54) * sVar54;
  sVar52 = auVar48._2_2_;
  sVar54 = auVar55._2_2_;
  uVar60 = (ushort)(sVar52 < sVar54) * sVar52 | (ushort)(sVar52 >= sVar54) * sVar54;
  sVar7 = auVar48._4_2_;
  sVar54 = auVar55._4_2_;
  uVar61 = (ushort)(sVar7 < sVar54) * sVar7 | (ushort)(sVar7 >= sVar54) * sVar54;
  sVar8 = auVar48._6_2_;
  sVar54 = auVar55._6_2_;
  uVar62 = (ushort)(sVar8 < sVar54) * sVar8 | (ushort)(sVar8 >= sVar54) * sVar54;
  sVar9 = auVar48._8_2_;
  sVar54 = auVar55._8_2_;
  uVar63 = (ushort)(sVar9 < sVar54) * sVar9 | (ushort)(sVar9 >= sVar54) * sVar54;
  sVar10 = auVar48._10_2_;
  sVar54 = auVar55._10_2_;
  uVar64 = (ushort)(sVar10 < sVar54) * sVar10 | (ushort)(sVar10 >= sVar54) * sVar54;
  sVar11 = auVar48._12_2_;
  sVar54 = auVar55._12_2_;
  sVar67 = auVar55._14_2_;
  uVar65 = (ushort)(sVar11 < sVar54) * sVar11 | (ushort)(sVar11 >= sVar54) * sVar54;
  sVar12 = auVar48._14_2_;
  uVar66 = (ushort)(sVar12 < sVar67) * sVar12 | (ushort)(sVar12 >= sVar67) * sVar67;
  sVar54 = auVar70._0_2_;
  auVar56._0_2_ = (ushort)((short)uVar53 < sVar54) * sVar54 | ((short)uVar53 >= sVar54) * uVar53;
  sVar67 = auVar70._2_2_;
  auVar56._2_2_ = (ushort)((short)uVar60 < sVar67) * sVar67 | ((short)uVar60 >= sVar67) * uVar60;
  sVar1 = auVar70._4_2_;
  auVar56._4_2_ = (ushort)((short)uVar61 < sVar1) * sVar1 | ((short)uVar61 >= sVar1) * uVar61;
  sVar2 = auVar70._6_2_;
  auVar56._6_2_ = (ushort)((short)uVar62 < sVar2) * sVar2 | ((short)uVar62 >= sVar2) * uVar62;
  sVar3 = auVar70._8_2_;
  auVar56._8_2_ = (ushort)((short)uVar63 < sVar3) * sVar3 | ((short)uVar63 >= sVar3) * uVar63;
  sVar4 = auVar70._10_2_;
  auVar56._10_2_ = (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
  sVar5 = auVar70._12_2_;
  auVar56._12_2_ = (ushort)((short)uVar65 < sVar5) * sVar5 | ((short)uVar65 >= sVar5) * uVar65;
  sVar6 = auVar70._14_2_;
  auVar56._14_2_ = (ushort)((short)uVar66 < sVar6) * sVar6 | ((short)uVar66 >= sVar6) * uVar66;
  auVar48 = psubsw(auVar56 >> 0x40 & (undefined1  [16])hev,auVar56);
  auVar48 = psubsw(auVar48,auVar56);
  auVar48 = psubsw(auVar48,auVar56);
  sVar42 = auVar48._0_2_;
  uVar53 = (ushort)(sVar51 < sVar42) * sVar51 | (ushort)(sVar51 >= sVar42) * sVar42;
  sVar42 = auVar48._2_2_;
  uVar60 = (ushort)(sVar52 < sVar42) * sVar52 | (ushort)(sVar52 >= sVar42) * sVar42;
  sVar42 = auVar48._4_2_;
  uVar61 = (ushort)(sVar7 < sVar42) * sVar7 | (ushort)(sVar7 >= sVar42) * sVar42;
  sVar42 = auVar48._6_2_;
  uVar62 = (ushort)(sVar8 < sVar42) * sVar8 | (ushort)(sVar8 >= sVar42) * sVar42;
  sVar42 = auVar48._8_2_;
  uVar63 = (ushort)(sVar9 < sVar42) * sVar9 | (ushort)(sVar9 >= sVar42) * sVar42;
  sVar42 = auVar48._10_2_;
  uVar64 = (ushort)(sVar10 < sVar42) * sVar10 | (ushort)(sVar10 >= sVar42) * sVar42;
  sVar42 = auVar48._12_2_;
  sVar44 = auVar48._14_2_;
  uVar65 = (ushort)(sVar11 < sVar42) * sVar11 | (ushort)(sVar11 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar12 < sVar44) * sVar12 | (ushort)(sVar12 >= sVar44) * sVar44;
  auVar68._0_2_ = (ushort)((short)uVar53 < sVar54) * sVar54 | ((short)uVar53 >= sVar54) * uVar53;
  auVar68._2_2_ = (ushort)((short)uVar60 < sVar67) * sVar67 | ((short)uVar60 >= sVar67) * uVar60;
  auVar68._4_2_ = (ushort)((short)uVar61 < sVar1) * sVar1 | ((short)uVar61 >= sVar1) * uVar61;
  auVar68._6_2_ = (ushort)((short)uVar62 < sVar2) * sVar2 | ((short)uVar62 >= sVar2) * uVar62;
  auVar68._8_2_ = (ushort)((short)uVar63 < sVar3) * sVar3 | ((short)uVar63 >= sVar3) * uVar63;
  auVar68._10_2_ = (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
  auVar68._12_2_ = (ushort)((short)uVar65 < sVar5) * sVar5 | ((short)uVar65 >= sVar5) * uVar65;
  auVar68._14_2_ = (ushort)((short)uVar66 < sVar6) * sVar6 | ((short)uVar66 >= sVar6) * uVar66;
  auVar68 = auVar68 & (undefined1  [16])mask;
  auVar57._0_8_ = auVar68._0_8_;
  auVar57._8_4_ = auVar68._0_4_;
  auVar57._12_4_ = auVar68._4_4_;
  auVar48 = paddsw(auVar57,_DAT_0046e8c0);
  sVar42 = auVar48._0_2_;
  uVar53 = (ushort)(sVar51 < sVar42) * sVar51 | (ushort)(sVar51 >= sVar42) * sVar42;
  sVar42 = auVar48._2_2_;
  uVar60 = (ushort)(sVar52 < sVar42) * sVar52 | (ushort)(sVar52 >= sVar42) * sVar42;
  sVar42 = auVar48._4_2_;
  uVar61 = (ushort)(sVar7 < sVar42) * sVar7 | (ushort)(sVar7 >= sVar42) * sVar42;
  sVar42 = auVar48._6_2_;
  uVar62 = (ushort)(sVar8 < sVar42) * sVar8 | (ushort)(sVar8 >= sVar42) * sVar42;
  sVar42 = auVar48._8_2_;
  uVar63 = (ushort)(sVar9 < sVar42) * sVar9 | (ushort)(sVar9 >= sVar42) * sVar42;
  sVar42 = auVar48._10_2_;
  uVar64 = (ushort)(sVar10 < sVar42) * sVar10 | (ushort)(sVar10 >= sVar42) * sVar42;
  sVar42 = auVar48._12_2_;
  sVar44 = auVar48._14_2_;
  uVar65 = (ushort)(sVar11 < sVar42) * sVar11 | (ushort)(sVar11 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar12 < sVar44) * sVar12 | (ushort)(sVar12 >= sVar44) * sVar44;
  auVar58._0_2_ = (ushort)((short)uVar53 < sVar54) * sVar54 | ((short)uVar53 >= sVar54) * uVar53;
  auVar58._2_2_ = (ushort)((short)uVar60 < sVar67) * sVar67 | ((short)uVar60 >= sVar67) * uVar60;
  auVar58._4_2_ = (ushort)((short)uVar61 < sVar1) * sVar1 | ((short)uVar61 >= sVar1) * uVar61;
  auVar58._6_2_ = (ushort)((short)uVar62 < sVar2) * sVar2 | ((short)uVar62 >= sVar2) * uVar62;
  auVar58._8_2_ = (ushort)((short)uVar63 < sVar3) * sVar3 | ((short)uVar63 >= sVar3) * uVar63;
  auVar58._10_2_ = (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
  auVar58._12_2_ = (ushort)((short)uVar65 < sVar5) * sVar5 | ((short)uVar65 >= sVar5) * uVar65;
  auVar58._14_2_ = (ushort)((short)uVar66 < sVar6) * sVar6 | ((short)uVar66 >= sVar6) * uVar66;
  auVar48 = psraw(auVar58,3);
  auVar69._0_2_ = auVar48._0_2_ + 1;
  auVar69._2_2_ = auVar48._2_2_ + 1;
  auVar69._4_2_ = auVar48._4_2_ + 1;
  auVar69._6_2_ = auVar48._6_2_ + 1;
  auVar69._8_2_ = auVar48._0_2_ + 1;
  auVar69._10_2_ = auVar48._2_2_ + 1;
  auVar69._12_2_ = auVar48._4_2_ + 1;
  auVar69._14_2_ = auVar48._6_2_ + 1;
  auVar55 = psraw(auVar69,1);
  auVar49._8_8_ = SUB168(~(undefined1  [16])hev & auVar55,8);
  auVar49._0_8_ = auVar48._8_8_;
  auVar59._8_8_ = SUB168(~(undefined1  [16])hev & auVar55,0);
  auVar59._0_8_ = auVar48._0_8_;
  auVar48 = psubsw(auVar43,auVar59);
  auVar43 = paddsw(auVar49,auVar47);
  sVar42 = auVar48._0_2_;
  uVar53 = (ushort)(sVar51 < sVar42) * sVar51 | (ushort)(sVar51 >= sVar42) * sVar42;
  sVar42 = auVar48._2_2_;
  uVar60 = (ushort)(sVar52 < sVar42) * sVar52 | (ushort)(sVar52 >= sVar42) * sVar42;
  sVar42 = auVar48._4_2_;
  uVar61 = (ushort)(sVar7 < sVar42) * sVar7 | (ushort)(sVar7 >= sVar42) * sVar42;
  sVar42 = auVar48._6_2_;
  uVar62 = (ushort)(sVar8 < sVar42) * sVar8 | (ushort)(sVar8 >= sVar42) * sVar42;
  sVar42 = auVar48._8_2_;
  uVar63 = (ushort)(sVar9 < sVar42) * sVar9 | (ushort)(sVar9 >= sVar42) * sVar42;
  sVar42 = auVar48._10_2_;
  uVar64 = (ushort)(sVar10 < sVar42) * sVar10 | (ushort)(sVar10 >= sVar42) * sVar42;
  sVar42 = auVar48._12_2_;
  sVar44 = auVar48._14_2_;
  uVar65 = (ushort)(sVar11 < sVar42) * sVar11 | (ushort)(sVar11 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar12 < sVar44) * sVar12 | (ushort)(sVar12 >= sVar44) * sVar44;
  auVar48._0_2_ = (ushort)((short)uVar53 < sVar54) * sVar54 | ((short)uVar53 >= sVar54) * uVar53;
  auVar48._2_2_ = (ushort)((short)uVar60 < sVar67) * sVar67 | ((short)uVar60 >= sVar67) * uVar60;
  auVar48._4_2_ = (ushort)((short)uVar61 < sVar1) * sVar1 | ((short)uVar61 >= sVar1) * uVar61;
  auVar48._6_2_ = (ushort)((short)uVar62 < sVar2) * sVar2 | ((short)uVar62 >= sVar2) * uVar62;
  auVar48._8_2_ = (ushort)((short)uVar63 < sVar3) * sVar3 | ((short)uVar63 >= sVar3) * uVar63;
  auVar48._10_2_ = (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
  auVar48._12_2_ = (ushort)((short)uVar65 < sVar5) * sVar5 | ((short)uVar65 >= sVar5) * uVar65;
  auVar48._14_2_ = (ushort)((short)uVar66 < sVar6) * sVar6 | ((short)uVar66 >= sVar6) * uVar66;
  sVar42 = auVar43._0_2_;
  uVar53 = (ushort)(sVar51 < sVar42) * sVar51 | (ushort)(sVar51 >= sVar42) * sVar42;
  sVar51 = auVar43._2_2_;
  uVar60 = (ushort)(sVar52 < sVar51) * sVar52 | (ushort)(sVar52 >= sVar51) * sVar51;
  sVar51 = auVar43._4_2_;
  uVar61 = (ushort)(sVar7 < sVar51) * sVar7 | (ushort)(sVar7 >= sVar51) * sVar51;
  sVar51 = auVar43._6_2_;
  uVar62 = (ushort)(sVar8 < sVar51) * sVar8 | (ushort)(sVar8 >= sVar51) * sVar51;
  sVar51 = auVar43._8_2_;
  uVar63 = (ushort)(sVar9 < sVar51) * sVar9 | (ushort)(sVar9 >= sVar51) * sVar51;
  sVar51 = auVar43._10_2_;
  uVar64 = (ushort)(sVar10 < sVar51) * sVar10 | (ushort)(sVar10 >= sVar51) * sVar51;
  sVar51 = auVar43._12_2_;
  sVar52 = auVar43._14_2_;
  uVar65 = (ushort)(sVar11 < sVar51) * sVar11 | (ushort)(sVar11 >= sVar51) * sVar51;
  uVar66 = (ushort)(sVar12 < sVar52) * sVar12 | (ushort)(sVar12 >= sVar52) * sVar52;
  auVar50._0_2_ = (ushort)((short)uVar53 < sVar54) * sVar54 | ((short)uVar53 >= sVar54) * uVar53;
  auVar50._2_2_ = (ushort)((short)uVar60 < sVar67) * sVar67 | ((short)uVar60 >= sVar67) * uVar60;
  auVar50._4_2_ = (ushort)((short)uVar61 < sVar1) * sVar1 | ((short)uVar61 >= sVar1) * uVar61;
  auVar50._6_2_ = (ushort)((short)uVar62 < sVar2) * sVar2 | ((short)uVar62 >= sVar2) * uVar62;
  auVar50._8_2_ = (ushort)((short)uVar63 < sVar3) * sVar3 | ((short)uVar63 >= sVar3) * uVar63;
  auVar50._10_2_ = (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
  auVar50._12_2_ = (ushort)((short)uVar65 < sVar5) * sVar5 | ((short)uVar65 >= sVar5) * uVar65;
  auVar50._14_2_ = (ushort)((short)uVar66 < sVar6) * sVar6 | ((short)uVar66 >= sVar6) * uVar66;
  auVar48 = paddsw(auVar48,auVar46);
  auVar46 = paddsw(auVar50,auVar46);
  *(long *)(s + -(long)(p * 2)) = auVar46._8_8_;
  *(long *)(s + -lVar41) = auVar46._0_8_;
  *(long *)s = auVar48._0_8_;
  *(long *)(s + lVar41) = auVar48._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p1p0, q1q0;
  __m128i p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));

  highbd_lpf_internal_4_sse2(&p1, &p0, &q0, &q1, &q1q0, &p1p0, _blimit, _limit,
                             _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
}